

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O0

void duckdb::RLESelect<long>
               (ColumnSegment *segment,ColumnScanState *state,idx_t vector_count,Vector *result,
               SelectionVector *sel,idx_t sel_count)

{
  bool bVar1;
  RLEScanState<long> *pRVar2;
  long *plVar3;
  idx_t iVar4;
  long *plVar5;
  idx_t iVar6;
  InternalException *this;
  idx_t in_RDX;
  ColumnSegment *in_RDI;
  SelectionVector *in_R8;
  ulong in_R9;
  idx_t next_idx;
  idx_t i;
  idx_t prev_idx;
  long *result_data;
  rle_count_t *index_pointer;
  long *data_pointer;
  data_ptr_t data;
  RLEScanState<long> *scan_state;
  string *in_stack_ffffffffffffff38;
  Vector *in_stack_ffffffffffffff40;
  idx_t in_stack_ffffffffffffff48;
  allocator *paVar7;
  long *data_pointer_00;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  RLEScanState<long> *in_stack_ffffffffffffff60;
  allocator in_stack_ffffffffffffff6f;
  Vector *in_stack_ffffffffffffff70;
  ulong local_68;
  ulong local_60;
  
  unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>::
  operator->((unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
              *)in_stack_ffffffffffffff40);
  pRVar2 = SegmentScanState::Cast<duckdb::RLEScanState<long>>
                     ((SegmentScanState *)in_stack_ffffffffffffff40);
  plVar3 = (long *)BufferHandle::Ptr((BufferHandle *)0xa4e159);
  iVar4 = ColumnSegment::GetBlockOffset(in_RDI);
  data_pointer_00 = plVar3;
  bVar1 = CanEmitConstantVector<true>
                    (pRVar2->position_in_entry,
                     (ulong)*(ushort *)
                             ((long)plVar3 +
                             pRVar2->entry_pos * 2 + pRVar2->rle_count_offset + iVar4),in_RDX);
  if (bVar1) {
    RLEScanConstant<long>
              (in_stack_ffffffffffffff60,
               (rle_count_t *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
               data_pointer_00,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  }
  else {
    plVar5 = FlatVector::GetData<long>((Vector *)0xa4e21f);
    Vector::SetVectorType(in_stack_ffffffffffffff70,(VectorType)in_stack_ffffffffffffff6f);
    local_60 = 0;
    for (local_68 = 0; local_68 < in_R9; local_68 = local_68 + 1) {
      iVar6 = SelectionVector::get_index(in_R8,local_68);
      if (iVar6 < local_60) {
        this = (InternalException *)__cxa_allocate_exception(0x10);
        paVar7 = (allocator *)&stack0xffffffffffffff6f;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&stack0xffffffffffffff70,
                   "Error in RLESelect - selection vector indices are not ordered",paVar7);
        InternalException::InternalException(this,in_stack_ffffffffffffff38);
        __cxa_throw(this,&InternalException::typeinfo,InternalException::~InternalException);
      }
      RLEScanState<long>::SkipInternal
                (in_stack_ffffffffffffff60,
                 (rle_count_t *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                 (idx_t)data_pointer_00);
      plVar5[local_68] = *(long *)((long)plVar3 + pRVar2->entry_pos * 8 + iVar4 + 8);
      local_60 = iVar6;
    }
    RLEScanState<long>::SkipInternal
              (in_stack_ffffffffffffff60,
               (rle_count_t *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
               (idx_t)data_pointer_00);
  }
  return;
}

Assistant:

void RLESelect(ColumnSegment &segment, ColumnScanState &state, idx_t vector_count, Vector &result,
               const SelectionVector &sel, idx_t sel_count) {
	auto &scan_state = state.scan_state->Cast<RLEScanState<T>>();

	auto data = scan_state.handle.Ptr() + segment.GetBlockOffset();
	auto data_pointer = reinterpret_cast<T *>(data + RLEConstants::RLE_HEADER_SIZE);
	auto index_pointer = reinterpret_cast<rle_count_t *>(data + scan_state.rle_count_offset);

	// If we are scanning an entire Vector and it contains only a single run we don't need to select at all
	if (CanEmitConstantVector<true>(scan_state.position_in_entry, index_pointer[scan_state.entry_pos], vector_count)) {
		RLEScanConstant<T>(scan_state, index_pointer, data_pointer, vector_count, result);
		return;
	}

	auto result_data = FlatVector::GetData<T>(result);
	result.SetVectorType(VectorType::FLAT_VECTOR);

	idx_t prev_idx = 0;
	for (idx_t i = 0; i < sel_count; i++) {
		auto next_idx = sel.get_index(i);
		if (next_idx < prev_idx) {
			throw InternalException("Error in RLESelect - selection vector indices are not ordered");
		}
		// skip forward to the next index
		scan_state.SkipInternal(index_pointer, next_idx - prev_idx);
		// read the element
		result_data[i] = data_pointer[scan_state.entry_pos];
		// move the next to the prev
		prev_idx = next_idx;
	}
	// skip the tail
	scan_state.SkipInternal(index_pointer, vector_count - prev_idx);
}